

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::Process(FoldSpecConstantOpAndCompositePass *this)

{
  bool bVar1;
  uint uVar2;
  Op OVar3;
  Status SVar4;
  IRContext *this_00;
  ConstantManager *this_01;
  Instruction *inst_00;
  Type *pTVar5;
  Constant *const_value_00;
  bool bVar6;
  Constant *const_value;
  Op opcode;
  Instruction *inst;
  iterator_template<spvtools::opt::Instruction> local_30;
  inst_iterator inst_iter;
  inst_iterator next_inst;
  ConstantManager *const_mgr;
  bool modified;
  FoldSpecConstantOpAndCompositePass *this_local;
  
  bVar6 = false;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_constant_mgr(this_00);
  Pass::context(&this->super_Pass);
  IRContext::types_values_begin((IRContext *)&inst_iter);
  InstructionList::iterator::iterator((iterator *)&local_30,&inst_iter);
  do {
    Pass::context(&this->super_Pass);
    IRContext::types_values_end((IRContext *)&inst);
    bVar1 = utils::operator!=(&local_30,(iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) {
      SVar4 = SuccessWithoutChange;
      if (bVar6) {
        SVar4 = SuccessWithChange;
      }
      return SVar4;
    }
    InstructionList::iterator::operator++(&inst_iter);
    inst_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&local_30);
    pTVar5 = analysis::ConstantManager::GetType(this_01,inst_00);
    if (pTVar5 == (Type *)0x0) {
LAB_0038f3ae:
      OVar3 = Instruction::opcode(inst_00);
      if (((OVar3 - OpConstantTrue < 4) || (OVar3 == OpConstantNull)) ||
         (OVar3 == OpSpecConstantComposite)) {
        const_value_00 = analysis::ConstantManager::GetConstantFromInst(this_01,inst_00);
        if (const_value_00 != (Constant *)0x0) {
          if (OVar3 == OpSpecConstantComposite) {
            Instruction::SetOpcode(inst_00,OpConstantComposite);
            bVar6 = true;
          }
          analysis::ConstantManager::MapConstantToInst(this_01,const_value_00,inst_00);
        }
      }
      else if (OVar3 == OpSpecConstantOp) {
        bVar1 = ProcessOpSpecConstantOp(this,(inst_iterator *)&local_30);
        bVar6 = bVar6 || bVar1;
      }
    }
    else {
      pTVar5 = analysis::ConstantManager::GetType(this_01,inst_00);
      uVar2 = (*pTVar5->_vptr_Type[4])();
      if ((uVar2 & 1) != 0) goto LAB_0038f3ae;
    }
    InstructionList::iterator::operator=((iterator *)&local_30,&inst_iter);
  } while( true );
}

Assistant:

Pass::Status FoldSpecConstantOpAndCompositePass::Process() {
  bool modified = false;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  // Traverse through all the constant defining instructions. For Normal
  // Constants whose values are determined and do not depend on OpUndef
  // instructions, records their values in two internal maps: id_to_const_val_
  // and const_val_to_id_ so that we can use them to infer the value of Spec
  // Constants later.
  // For Spec Constants defined with OpSpecConstantComposite instructions, if
  // all of their components are Normal Constants, they will be turned into
  // Normal Constants too. For Spec Constants defined with OpSpecConstantOp
  // instructions, we check if they only depends on Normal Constants and fold
  // them when possible. The two maps for Normal Constants: id_to_const_val_
  // and const_val_to_id_ will be updated along the traversal so that the new
  // Normal Constants generated from folding can be used to fold following Spec
  // Constants.
  // This algorithm depends on the SSA property of SPIR-V when
  // defining constants. The dependent constants must be defined before the
  // dependee constants. So a dependent Spec Constant must be defined and
  // will be processed before its dependee Spec Constant. When we encounter
  // the dependee Spec Constants, all its dependent constants must have been
  // processed and all its dependent Spec Constants should have been folded if
  // possible.
  Module::inst_iterator next_inst = context()->types_values_begin();
  for (Module::inst_iterator inst_iter = next_inst;
       // Need to re-evaluate the end iterator since we may modify the list of
       // instructions in this section of the module as the process goes.
       inst_iter != context()->types_values_end(); inst_iter = next_inst) {
    ++next_inst;
    Instruction* inst = &*inst_iter;
    // Collect constant values of normal constants and process the
    // OpSpecConstantOp and OpSpecConstantComposite instructions if possible.
    // The constant values will be stored in analysis::Constant instances.
    // OpConstantSampler instruction is not collected here because it cannot be
    // used in OpSpecConstant{Composite|Op} instructions.
    // TODO(qining): If the constant or its type has decoration, we may need
    // to skip it.
    if (const_mgr->GetType(inst) &&
        !const_mgr->GetType(inst)->decoration_empty())
      continue;
    switch (spv::Op opcode = inst->opcode()) {
      // Records the values of Normal Constants.
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantComposite:
      case spv::Op::OpSpecConstantComposite: {
        // A Constant instance will be created if the given instruction is a
        // Normal Constant whose value(s) are fixed. Note that for a composite
        // Spec Constant defined with OpSpecConstantComposite instruction, if
        // all of its components are Normal Constants already, the Spec
        // Constant will be turned in to a Normal Constant. In that case, a
        // Constant instance should also be created successfully and recorded
        // in the id_to_const_val_ and const_val_to_id_ mapps.
        if (auto const_value = const_mgr->GetConstantFromInst(inst)) {
          // Need to replace the OpSpecConstantComposite instruction with a
          // corresponding OpConstantComposite instruction.
          if (opcode == spv::Op::OpSpecConstantComposite) {
            inst->SetOpcode(spv::Op::OpConstantComposite);
            modified = true;
          }
          const_mgr->MapConstantToInst(const_value, inst);
        }
        break;
      }
      // For a Spec Constants defined with OpSpecConstantOp instruction, check
      // if it only depends on Normal Constants. If so, the Spec Constant will
      // be folded. The original Spec Constant defining instruction will be
      // replaced by Normal Constant defining instructions, and the new Normal
      // Constants will be added to id_to_const_val_ and const_val_to_id_ so
      // that we can use the new Normal Constants when folding following Spec
      // Constants.
      case spv::Op::OpSpecConstantOp:
        modified |= ProcessOpSpecConstantOp(&inst_iter);
        break;
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}